

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  llama_token lVar8;
  undefined8 uVar9;
  common_log *pcVar10;
  long lVar11;
  long lVar12;
  common_sampler *gsmpl;
  ulong uVar13;
  ulong uVar14;
  pointer pvVar15;
  int i;
  long lVar16;
  long lVar17;
  int i_3;
  int iVar18;
  int iVar19;
  char *fmt;
  int i_2;
  long lVar20;
  long lVar21;
  int s;
  int iVar22;
  ulong uVar23;
  int f;
  pointer piVar24;
  pointer piVar25;
  int j_1;
  ulong uVar26;
  _Head_base<0UL,_llama_context_*,_false> _Var27;
  int s_1;
  ulong uVar28;
  float fVar29;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  llama_token id;
  char local_1612;
  allocator_type local_1611;
  ulong local_1610;
  tuple<llama_model_*,_llama_model_deleter> local_1608;
  uint local_15fc;
  int local_15f8;
  int local_15f4;
  _Head_base<0UL,_llama_context_*,_false> local_15f0;
  vector<int,_std::allocator<int>_> inp;
  uint local_15cc;
  vector<ngram_data,_std::allocator<ngram_data>_> ngrams_cur;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  tokens_j;
  string token_str;
  llama_batch batch;
  vector<int,_std::allocator<int>_> seq_id_look;
  vector<int,_std::allocator<int>_> all;
  ngram_container ngrams_observed;
  vector<int,_std::allocator<int>_> seq_id_all;
  vector<int,_std::allocator<int>_> tokens_j_prev;
  common_init_result llama_init;
  llama_kv_cache_view kvc_view;
  undefined1 local_13e8 [56];
  undefined1 local_13b0 [56];
  common_params params;
  
  common_params::common_params(&params);
  bVar4 = common_params_parse(argc,argv,&params,LLAMA_EXAMPLE_COMMON,
                              (_func_void_int_char_ptr_ptr *)0x0);
  if (!bVar4) {
    iVar22 = 1;
    goto LAB_00130b1d;
  }
  common_init();
  local_1612 = params.dump_kv_cache;
  llama_backend_init();
  llama_numa_init(params.numa);
  common_init_from_params(&llama_init,&params);
  uVar9 = llama_model_get_vocab
                    (llama_init.model._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>.
                     _M_t.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                     super__Head_base<0UL,_llama_model_*,_false>._M_head_impl);
  local_1608.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
  super__Head_base<0UL,_llama_model_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>)
       (_Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>)
       llama_init.model._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
       super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
       super__Head_base<0UL,_llama_model_*,_false>._M_head_impl;
  inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar22 = 1;
  local_15f0._M_head_impl =
       (llama_context *)
       llama_init.context._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
       super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
       super__Head_base<0UL,_llama_context_*,_false>._M_head_impl;
  common_tokenize((vector<int,_std::allocator<int>_> *)&ngrams_observed,
                  (llama_context *)
                  llama_init.context._M_t.
                  super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                  super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                  super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,&params.prompt,true,
                  true);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&inp,&ngrams_observed);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ngrams_observed);
  std::vector<int,_std::allocator<int>_>::operator=(&all,&inp);
  iVar6 = llama_n_ctx(local_15f0._M_head_impl);
  if ((int)((ulong)((long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) <= (int)(iVar6 - 4U)) {
    if (-1 < common_log_verbosity_thold) {
      pcVar10 = common_log_main();
      common_log_add(pcVar10,GGML_LOG_LEVEL_NONE,"\n\n");
    }
    piVar24 = inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
    for (piVar25 = inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_start; piVar25 != piVar24; piVar25 = piVar25 + 1) {
      if (-1 < common_log_verbosity_thold) {
        lVar8 = *piVar25;
        pcVar10 = common_log_main();
        common_token_to_piece_abi_cxx11_
                  ((string *)&ngrams_observed,local_15f0._M_head_impl,lVar8,true);
        common_log_add(pcVar10,GGML_LOG_LEVEL_NONE,"%s",
                       CONCAT44(ngrams_observed._4_4_,ngrams_observed.n_total));
        std::__cxx11::string::~string((string *)&ngrams_observed);
      }
    }
    fflush(_stderr);
    uVar28 = (long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_finish -
             (long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_start;
    lVar11 = ggml_time_us();
    _Var27._M_head_impl = local_15f0._M_head_impl;
    uVar28 = uVar28 >> 2;
    llama_batch_get_one(local_13b0,
                        inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,(int)uVar28 + -1);
    llama_decode(_Var27._M_head_impl);
    llama_batch_get_one(local_13e8,
                        inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + -1,1);
    llama_decode(_Var27._M_head_impl);
    for (iVar22 = 1; iVar22 != 0x1f; iVar22 = iVar22 + 1) {
      llama_kv_self_seq_cp(local_15f0._M_head_impl,0,iVar22,0xffffffff,0xffffffff);
    }
    lVar12 = ggml_time_us();
    local_1610 = (long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
    id = 0;
    llama_batch_init(&batch,params.n_ctx,0);
    gsmpl = common_sampler_init((llama_model *)
                                local_1608.
                                super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                                super__Head_base<0UL,_llama_model_*,_false>._M_head_impl,
                                &params.sampling);
    std::vector<ngram_data,_std::allocator<ngram_data>_>::vector
              (&ngrams_cur,0xf,(allocator_type *)&ngrams_observed);
    std::vector<int,_std::allocator<int>_>::vector
              (&tokens_j_prev,0xf,(allocator_type *)&ngrams_observed);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&tokens_j,4,(allocator_type *)&ngrams_observed);
    local_1610 = local_1610 >> 2;
    for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
      std::vector<int,_std::allocator<int>_>::resize
                (tokens_j.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar20,0xf);
      piVar24 = tokens_j.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar20].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      for (lVar16 = 0; lVar16 != 0xf; lVar16 = lVar16 + 1) {
        piVar24[lVar16] = (int)lVar16 + 100;
      }
    }
    seq_id_look.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    seq_id_look.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    seq_id_look.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector
              (&seq_id_all,0x1f,(allocator_type *)&ngrams_observed);
    _Var27._M_head_impl = local_15f0._M_head_impl;
    for (lVar20 = 0; lVar20 != 0x1f; lVar20 = lVar20 + 1) {
      seq_id_all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar20] = (int)lVar20;
    }
    iVar22 = llama_vocab_n_tokens(uVar9);
    ngram_container::ngram_container(&ngrams_observed,iVar22,5,0xf);
    llama_kv_cache_view_init(&kvc_view,_Var27._M_head_impl,0x1f);
    lVar20 = ggml_time_us();
    id = common_sampler_sample(gsmpl,_Var27._M_head_impl,0,false);
    common_sampler_accept(gsmpl,id,true);
    common_token_to_piece_abi_cxx11_(&token_str,_Var27._M_head_impl,id,true);
    if (-1 < common_log_verbosity_thold) {
      pcVar10 = common_log_main();
      common_log_add(pcVar10,GGML_LOG_LEVEL_NONE,"%s",token_str._M_dataplus._M_p);
    }
    fflush(_stdout);
    std::__cxx11::string::~string((string *)&token_str);
    local_15fc = 0;
    local_15cc = 0;
    uVar14 = 0;
    do {
      if (local_1612 != '\0') {
        llama_kv_cache_view_update(_Var27._M_head_impl,&kvc_view);
        common_kv_cache_dump_view_seqs(&kvc_view,0x28);
      }
      common_batch_clear(&batch);
      common_batch_add(&batch,id,(llama_pos)local_1610,&seq_id_all,true);
      uVar7 = ngrams_observed.cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[id];
      std::vector<ngram_data,_std::allocator<ngram_data>_>::resize(&ngrams_cur,(long)(int)uVar7);
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      iVar22 = 0x10;
      for (lVar16 = 0; (ulong)uVar7 * 0x38 - lVar16 != 0; lVar16 = lVar16 + 0x38) {
        (&(ngrams_cur.super__Vector_base<ngram_data,_std::allocator<ngram_data>_>._M_impl.
           super__Vector_impl_data._M_start)->active)[lVar16] = true;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   (&(ngrams_cur.super__Vector_base<ngram_data,_std::allocator<ngram_data>_>._M_impl
                      .super__Vector_impl_data._M_start)->active + lVar16 + 0x20),5);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&((ngrams_cur.super__Vector_base<ngram_data,_std::allocator<ngram_data>_>.
                             _M_impl.super__Vector_impl_data._M_start)->i_batch).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar16),5);
        *(int *)((long)&(ngrams_cur.super__Vector_base<ngram_data,_std::allocator<ngram_data>_>.
                         _M_impl.super__Vector_impl_data._M_start)->seq_id + lVar16) = iVar22;
        **(undefined4 **)
          ((long)&((ngrams_cur.super__Vector_base<ngram_data,_std::allocator<ngram_data>_>._M_impl.
                    super__Vector_impl_data._M_start)->i_batch).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + lVar16) = 0;
        **(llama_token **)
          ((long)&((ngrams_cur.super__Vector_base<ngram_data,_std::allocator<ngram_data>_>._M_impl.
                    super__Vector_impl_data._M_start)->tokens).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + lVar16) = id;
        iVar22 = iVar22 + 1;
      }
      local_1608.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
      super__Head_base<0UL,_llama_model_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>)(ulong)((int)local_1610 + 1);
      uVar13 = 0;
      while (uVar13 != 4) {
        uVar26 = uVar13 & 0xffffffff;
        uVar23 = uVar13 + 1;
        local_15f8 = (int)local_1608.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                          super__Head_base<0UL,_llama_model_*,_false>._M_head_impl + (int)uVar13;
        iVar22 = 0x10;
        for (lVar16 = 0; uVar13 = uVar23, (ulong)uVar7 * 0xe != lVar16; lVar16 = lVar16 + 0xe) {
          lVar8 = ngrams_observed.tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[id * 0x3c + (int)uVar26];
          *(llama_token *)
           (*(long *)((long)&((ngrams_cur.
                               super__Vector_base<ngram_data,_std::allocator<ngram_data>_>._M_impl.
                               super__Vector_impl_data._M_start)->tokens).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar16 * 4) + uVar23 * 4) = lVar8;
          *(int32_t *)
           (*(long *)((long)&((ngrams_cur.
                               super__Vector_base<ngram_data,_std::allocator<ngram_data>_>._M_impl.
                               super__Vector_impl_data._M_start)->i_batch).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar16 * 4) + uVar23 * 4) =
               batch.n_tokens;
          __l._M_len = 1;
          __l._M_array = &local_15f4;
          local_15f4 = iVar22;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&token_str,__l,&local_1611);
          common_batch_add(&batch,lVar8,local_15f8,(vector<int,_std::allocator<int>_> *)&token_str,
                           true);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&token_str);
          iVar22 = iVar22 + 1;
          uVar26 = (ulong)((int)uVar26 + 4);
        }
      }
      iVar22 = 2;
      lVar16 = 0xe;
      lVar21 = 1;
      while (lVar21 != 0xf) {
        std::vector<int,_std::allocator<int>_>::resize(&seq_id_look,0xf - lVar21);
        for (lVar17 = 0; lVar16 != lVar17; lVar17 = lVar17 + 1) {
          seq_id_look.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar17] = iVar22 + (int)lVar17;
        }
        common_batch_add(&batch,((tokens_j.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar21],
                         (int)lVar21 + (int)local_1610,&seq_id_look,false);
        lVar16 = lVar16 + -1;
        iVar22 = iVar22 + 1;
        lVar21 = lVar21 + 1;
      }
      for (lVar16 = 1; _Var27._M_head_impl = local_15f0._M_head_impl, lVar16 != 4;
          lVar16 = lVar16 + 1) {
        for (lVar21 = 0; lVar21 != 0xf; lVar21 = lVar21 + 1) {
          lVar8 = tokens_j.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar16].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar21];
          local_15f4 = (int)lVar21 + 1;
          __l_00._M_len = 1;
          __l_00._M_array = &local_15f4;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&token_str,__l_00,&local_1611);
          common_batch_add(&batch,lVar8,
                           (int)local_1608.
                                super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                                super__Head_base<0UL,_llama_model_*,_false>._M_head_impl +
                           (int)lVar21,(vector<int,_std::allocator<int>_> *)&token_str,lVar16 == 3);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&token_str);
        }
        local_1608.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
        super__Head_base<0UL,_llama_model_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>)
             ((long)local_1608.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                    super__Head_base<0UL,_llama_model_*,_false>._M_head_impl + 1);
      }
      iVar22 = llama_decode(local_15f0._M_head_impl);
      if (iVar22 != 0) {
        iVar22 = 1;
        if (-1 < common_log_verbosity_thold) {
          pcVar10 = common_log_main();
          common_log_add(pcVar10,GGML_LOG_LEVEL_ERROR,
                         "\n\n%s: llama_decode failed - increase KV cache size\n","main");
        }
        goto LAB_00130aab;
      }
      iVar6 = (int)local_1610;
      iVar22 = (int)uVar14;
      local_15f8 = 0;
      for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
        if (lVar16 == 0) {
          iVar18 = 0;
        }
        else {
          uVar13 = ((long)ngrams_cur.super__Vector_base<ngram_data,_std::allocator<ngram_data>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)ngrams_cur.super__Vector_base<ngram_data,_std::allocator<ngram_data>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x38;
          uVar23 = uVar13 & 0xffffffff;
          if ((int)uVar13 < 1) {
            uVar23 = 0;
          }
          lVar21 = 0;
          do {
            lVar17 = lVar21;
            if (uVar23 * 0x38 + 0x38 == lVar17 + 0x38) goto LAB_00130709;
            lVar21 = lVar17 + 0x38;
          } while ((&(ngrams_cur.super__Vector_base<ngram_data,_std::allocator<ngram_data>_>._M_impl
                      .super__Vector_impl_data._M_start)->active)[lVar17] != true);
          iVar18 = *(int *)(*(long *)((long)&((ngrams_cur.
                                               super__Vector_base<ngram_data,_std::allocator<ngram_data>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->i_batch).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start + lVar17) + lVar16 * 4
                           );
          local_15f8 = *(int *)((long)&(ngrams_cur.
                                        super__Vector_base<ngram_data,_std::allocator<ngram_data>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->seq_id + lVar17);
          local_15cc = local_15cc + 1;
          if (iVar18 == 0) goto LAB_00130709;
        }
        id = common_sampler_sample(gsmpl,_Var27._M_head_impl,iVar18,false);
        common_sampler_accept(gsmpl,id,true);
        common_token_to_piece_abi_cxx11_(&token_str,_Var27._M_head_impl,id,true);
        if (lVar16 == 0) {
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            fmt = "%s";
            goto LAB_001303cb;
          }
        }
        else if (-1 < common_log_verbosity_thold) {
          pcVar10 = common_log_main();
          fmt = "\x1b[0;96m%s\x1b[0m";
LAB_001303cb:
          common_log_add(pcVar10,GGML_LOG_LEVEL_NONE,fmt,token_str._M_dataplus._M_p);
        }
        fflush(_stdout);
        cVar5 = llama_vocab_is_eog(uVar9,id);
        local_15fc = local_15fc & 0xff;
        if (cVar5 != '\0') {
          local_15fc = 1;
        }
        std::vector<int,_std::allocator<int>_>::push_back(&all,&id);
        std::__cxx11::string::~string((string *)&token_str);
        uVar7 = (int)uVar14 + 1;
        local_1608.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
        super__Head_base<0UL,_llama_model_*,_false>._M_head_impl._0_4_ = uVar7;
        local_1610 = (ulong)((int)local_1610 + 1);
        if ((params.n_predict <= (int)uVar14 && -1 < params.n_predict) || ((local_15fc & 1) != 0))
        goto LAB_00130707;
        uVar14 = ((long)ngrams_cur.super__Vector_base<ngram_data,_std::allocator<ngram_data>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)ngrams_cur.super__Vector_base<ngram_data,_std::allocator<ngram_data>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x38;
        uVar13 = uVar14 & 0xffffffff;
        if ((int)uVar14 < 1) {
          uVar13 = 0;
        }
        for (lVar21 = 0; uVar13 * 0x38 - lVar21 != 0; lVar21 = lVar21 + 0x38) {
          if (((&(ngrams_cur.super__Vector_base<ngram_data,_std::allocator<ngram_data>_>._M_impl.
                  super__Vector_impl_data._M_start)->active)[lVar21] == true) &&
             ((lVar16 == 4 ||
              (id != *(int *)(*(long *)((long)&((ngrams_cur.
                                                 super__Vector_base<ngram_data,_std::allocator<ngram_data>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->tokens)
                                               .super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start + lVar21) +
                              4 + lVar16 * 4))))) {
            (&(ngrams_cur.super__Vector_base<ngram_data,_std::allocator<ngram_data>_>._M_impl.
               super__Vector_impl_data._M_start)->active)[lVar21] = false;
          }
        }
        piVar24 = ((tokens_j.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                  _M_start;
        for (lVar21 = 0; lVar21 != 0xf; lVar21 = lVar21 + 1) {
          tokens_j_prev.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar21] = piVar24[lVar21];
        }
        lVar21 = 0x18;
        while (lVar21 + 0x18 != 0x78) {
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&tokens_j.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar21),
                     (vector<int,_std::allocator<int>_> *)
                     ((long)&((tokens_j.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar21));
          lVar21 = lVar21 + 0x18;
        }
        if (lVar16 == 0) {
          for (lVar21 = 0; lVar21 != 0xf; lVar21 = lVar21 + 1) {
            lVar8 = common_sampler_sample
                              (gsmpl,_Var27._M_head_impl,
                               (int)lVar21 +
                               (int)(((long)ngrams_cur.
                                            super__Vector_base<ngram_data,_std::allocator<ngram_data>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ngrams_cur.
                                           super__Vector_base<ngram_data,_std::allocator<ngram_data>_>
                                           ._M_impl.super__Vector_impl_data._M_start) / 0x38) * 4 +
                               0x2d,false);
            tokens_j.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[3].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar21] = lVar8;
          }
        }
        else {
          piVar24 = ((tokens_j.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_start;
          piVar25 = tokens_j.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          for (lVar21 = 0; lVar21 != 0xf; lVar21 = lVar21 + 1) {
            piVar25[lVar21] = piVar24[lVar21];
          }
        }
        if (lVar16 == 0) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&token_str,4,(allocator_type *)&local_15f4
                    );
          for (lVar21 = 0; lVar21 != 0xf; lVar21 = lVar21 + 1) {
            iVar18 = tokens_j_prev.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar21];
            pvVar15 = tokens_j.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
              *(int *)(token_str._M_dataplus._M_p + lVar17 * 4) =
                   (pvVar15->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar21];
              pvVar15 = pvVar15 + 1;
            }
            uVar14 = (ulong)(uint)ngrams_observed.cnt.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar18];
            if (ngrams_observed.cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar18] < 1) {
              uVar14 = 0;
            }
            piVar24 = ngrams_observed.tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar18 * 0x3c;
            for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
              lVar17 = 0;
              do {
                if (lVar17 == 4) goto LAB_001306b8;
                piVar2 = piVar24 + lVar17;
                lVar1 = lVar17 * 4;
                lVar17 = lVar17 + 1;
              } while (*piVar2 == *(int *)(token_str._M_dataplus._M_p + lVar1));
              piVar24 = piVar24 + 4;
            }
            iVar3 = ngrams_observed.head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar18];
            for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
              ngrams_observed.tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(iVar18 * 0x3c + iVar3 * 4) + lVar17] =
                   *(int *)(token_str._M_dataplus._M_p + lVar17 * 4);
            }
            iVar19 = ngrams_observed.cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar18];
            if (0xd < iVar19) {
              iVar19 = 0xe;
            }
            ngrams_observed.cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar18] = iVar19 + 1;
            ngrams_observed.head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar18] = (iVar3 + 1) % 0xf;
            ngrams_observed.n_total = ngrams_observed.n_total + 1;
LAB_001306b8:
            _Var27._M_head_impl = local_15f0._M_head_impl;
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&token_str);
        }
        uVar14 = (ulong)local_1608.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                        super__Head_base<0UL,_llama_model_*,_false>._M_head_impl & 0xffffffff;
      }
      local_1610 = (ulong)(iVar6 + 5);
      uVar7 = iVar22 + 5;
LAB_00130707:
      uVar14 = (ulong)uVar7;
LAB_00130709:
      iVar22 = local_15f8;
      if ((-1 < params.n_predict && params.n_predict < (int)uVar14) || ((local_15fc & 1) != 0))
      goto LAB_00130798;
      llama_kv_self_seq_rm(_Var27._M_head_impl,0xffffffff,local_1610);
      if (iVar22 != 0) {
        llama_kv_self_seq_keep(_Var27._M_head_impl,iVar22);
        llama_kv_self_seq_cp(_Var27._M_head_impl,iVar22,0,0xffffffffffffffff,0xffffffff);
        llama_kv_self_seq_rm(_Var27._M_head_impl,iVar22,0xffffffff);
        for (iVar22 = 1; iVar22 != 0x1f; iVar22 = iVar22 + 1) {
          llama_kv_self_seq_cp(_Var27._M_head_impl,0,iVar22,0xffffffffffffffff,0xffffffff);
        }
      }
    } while( true );
  }
  if (-1 < common_log_verbosity_thold) {
    pcVar10 = common_log_main();
    common_log_add(pcVar10,GGML_LOG_LEVEL_ERROR,"%s: prompt too long (%d tokens, max %d)\n","main",
                   (ulong)((long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2,(ulong)(iVar6 - 4U));
  }
  goto LAB_00130af9;
LAB_00130798:
  lVar16 = ggml_time_us();
  if (-1 < common_log_verbosity_thold) {
    pcVar10 = common_log_main();
    common_log_add(pcVar10,GGML_LOG_LEVEL_NONE,"\n\n");
    if (-1 < common_log_verbosity_thold) {
      pcVar10 = common_log_main();
      fVar29 = (float)(lVar12 - lVar11) / 1e+06;
      common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,
                     "encoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n",
                     SUB84((double)fVar29,0),
                     SUB84((double)((float)(ulong)((long)inp.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)inp.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 2) /
                                   fVar29),0),uVar28);
      if (-1 < common_log_verbosity_thold) {
        pcVar10 = common_log_main();
        fVar29 = (float)(lVar16 - lVar20) / 1e+06;
        common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,
                       "decoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n",
                       SUB84((double)fVar29,0),SUB84((double)((float)(int)uVar14 / fVar29),0),uVar14
                      );
        if (-1 < common_log_verbosity_thold) {
          pcVar10 = common_log_main();
          common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"\n");
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"W = %2d\n",0xf);
            if (-1 < common_log_verbosity_thold) {
              pcVar10 = common_log_main();
              common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"N = %2d\n",5);
              if (-1 < common_log_verbosity_thold) {
                pcVar10 = common_log_main();
                common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"G = %2d\n",0xf);
                if (-1 < common_log_verbosity_thold) {
                  pcVar10 = common_log_main();
                  common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"\n");
                  if (-1 < common_log_verbosity_thold) {
                    pcVar10 = common_log_main();
                    common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"n_predict = %d\n",uVar14);
                    if (-1 < common_log_verbosity_thold) {
                      pcVar10 = common_log_main();
                      common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"n_accept  = %d\n",
                                     (ulong)local_15cc);
                      if (-1 < common_log_verbosity_thold) {
                        pcVar10 = common_log_main();
                        common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"\n");
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  common_perf_print(_Var27._M_head_impl,gsmpl);
  common_sampler_free(gsmpl);
  llama_kv_cache_view_free(&kvc_view);
  llama_batch_free();
  llama_backend_free();
  if (common_log_verbosity_thold < 0) {
    iVar22 = 0;
  }
  else {
    pcVar10 = common_log_main();
    iVar22 = 0;
    common_log_add(pcVar10,GGML_LOG_LEVEL_NONE,"\n\n");
  }
LAB_00130aab:
  ngram_container::~ngram_container(&ngrams_observed);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&seq_id_all.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&seq_id_look.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&tokens_j);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&tokens_j_prev.super__Vector_base<int,_std::allocator<int>_>);
  std::vector<ngram_data,_std::allocator<ngram_data>_>::~vector(&ngrams_cur);
LAB_00130af9:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&all.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&inp.super__Vector_base<int,_std::allocator<int>_>);
  common_init_result::~common_init_result(&llama_init);
LAB_00130b1d:
  common_params::~common_params(&params);
  return iVar22;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_COMMON)) {
        return 1;
    }

    common_init();

    const int W = 15; // lookahead window
    const int N = 5;  // n-gram size
    const int G = 15; // max verification n-grams

    const bool dump_kv_cache = params.dump_kv_cache;

    // init llama.cpp
    llama_backend_init();
    llama_numa_init(params.numa);

    // load the target model
    common_init_result llama_init = common_init_from_params(params);

    llama_model * model = llama_init.model.get();
    llama_context * ctx = llama_init.context.get();

    const llama_vocab * vocab = llama_model_get_vocab(model);

    // Tokenize the prompt
    std::vector<llama_token> inp;
    std::vector<llama_token> all;

    inp = common_tokenize(ctx, params.prompt, true, true);
    all = inp;

    const int max_context_size     = llama_n_ctx(ctx);
    const int max_tokens_list_size = max_context_size - 4;

    if ((int) inp.size() > max_tokens_list_size) {
        LOG_ERR("%s: prompt too long (%d tokens, max %d)\n", __func__, (int) inp.size(), max_tokens_list_size);
        return 1;
    }

    LOG("\n\n");

    for (auto id : inp) {
        LOG("%s", common_token_to_piece(ctx, id).c_str());
    }

    fflush(stderr);

    const int n_input = inp.size();

    const auto t_enc_start = ggml_time_us();

    // eval the prompt
    llama_decode(ctx, llama_batch_get_one( inp.data(), n_input - 1));
    llama_decode(ctx, llama_batch_get_one(&inp.back(),           1));

    for (int s = 1; s < W + G + 1; ++s) {
        llama_kv_self_seq_cp(ctx, 0, s, -1, -1);
    }

    const auto t_enc_end = ggml_time_us();

    int n_predict = 0;
    int n_accept  = 0;

    int n_past = inp.size();

    llama_token id = 0;

    // used to determine end of generation
    bool has_eos = false;

    // for each decoded batch, we have at most W + G + 1 distinct sequences:
    // seq_id == 0           : the current input token
    // seq_id [1, W]         : tokens from the past N - 1 Jacobi iterations
    // seq_id [W + 1, W + G] : verification n-grams
    llama_batch batch = llama_batch_init(params.n_ctx, 0, W + G + 1);

    // target model sampling context
    struct common_sampler * smpl = common_sampler_init(model, params.sampling);

    // verification n-grams
    std::vector<ngram_data> ngrams_cur(G);

    // tokens for the past N - 1 Jacobi iterations
    std::vector<llama_token> tokens_j_prev(W);
    std::vector<std::vector<llama_token>> tokens_j(N - 1);
    for (int j = 0; j < N - 1; j++) {
        tokens_j[j].resize(W);

        for (int i = 0; i < W; i++) {
            // there are different ways to init these tokens
            if (0) {
                // initialize randomly from the prompt tokens
                tokens_j[j][i] = all[1 + rand() % (all.size() - 1)];
            } else {
                // initialize with a sequence of increasing numbers
                tokens_j[j][i] = 100 + i;
            }
        }
    }

    std::vector<llama_seq_id> seq_id_look;

    // the input token belongs both to all sequences
    std::vector<llama_seq_id> seq_id_all(W + G + 1);
    for (int i = 0; i < W + G + 1; i++) {
        seq_id_all[i] = i;
    }

    // here we keep adding new n-grams as we go
    ngram_container ngrams_observed(llama_vocab_n_tokens(vocab), N, G);

    // debug
    struct llama_kv_cache_view kvc_view = llama_kv_cache_view_init(ctx, W + G + 1);

    const auto t_dec_start = ggml_time_us();

    // sample first token
    {
        id = common_sampler_sample(smpl, ctx, 0);

        common_sampler_accept(smpl, id, true);

        {
            const std::string token_str = common_token_to_piece(ctx, id);

            LOG("%s", token_str.c_str());
            fflush(stdout);
        }
    }

    while (true) {
        // debug
        if (dump_kv_cache) {
            llama_kv_cache_view_update(ctx, &kvc_view);
            common_kv_cache_dump_view_seqs(kvc_view, 40);
        }

        // build the mask from https://lmsys.org/blog/2023-11-21-lookahead-decoding/
        //
        // Example for W = 5, N = 4, G = 2:
        // (I = input, L = lookahead, V = verification)
        //
        // Batch:  0  1  2  3  4  5  6  7  8  9 10 11 12 13 14 15 16 17 18 19 20
        // T:        -2 -2 -2 -2 -1 -1 -1 -1 -1  0  0  0  0  0  0
        // Info:   I  L  L  L  L  L  L  L  L  L  L  L  L  L  L  V  V  V  V  V  V
        // Pos:    0  1  2  3  4  1  2  3  4  5  2  3  4  5  6  1  2  3  1  2  3   (+ n_past)
        // Logits: 1  0  0  0  0  0  0  0  0  0  1  1  1  1  1  1  1  1  1  1  1
        // ---------------------------------------------------------------------
        // Seq:    0
        //         1              1              1
        //         2  2              2              2
        //         3  3  3              3              3
        //         4  4  4  4              4              4
        //         5  5  5  5  5              5              5
        //         6                                            6  6  6
        //         7                                                     7  7  7
        // ---------------------------------------------------------------------
        //                                       |  |  |  |  |  |  |  |  |  |  |
        //                                       V  V  V  V  V  |  |  |  |  |  |
        //                                         j_tokens     |  |  |  |  |  |
        //                                                      V  V  V  V  V  V
        //                                                             id
        {
            common_batch_clear(batch);

            // current token - first token of the first level
            common_batch_add(batch, id, n_past, seq_id_all, true);

            // verification n-grams - queue this before the lookahead tokens for less KV cache fragmentation
            {
                const int g_cur = ngrams_observed.cnt[id];

                ngrams_cur.resize(g_cur);
                for (int g = 0; g < g_cur; g++) {
                    ngrams_cur[g].active = true;
                    ngrams_cur[g].tokens.resize(N);
                    ngrams_cur[g].i_batch.resize(N);
                    ngrams_cur[g].seq_id = W + 1 + g;
                    ngrams_cur[g].i_batch[0] = 0;
                    ngrams_cur[g].tokens [0] = id;
                }

                for (int j = 0; j < N - 1; j++) {
                    for (int g = 0; g < g_cur; g++) {
                        const int idx = id*(N - 1)*G + g*(N - 1);

                        const llama_token t = ngrams_observed.tokens[idx + j];

                        ngrams_cur[g].tokens [j + 1] = t;
                        ngrams_cur[g].i_batch[j + 1] = batch.n_tokens;

                        common_batch_add(batch, t, n_past + j + 1, { W + 1 + g }, true);
                    }
                }
            }

            // fill the remaining W - 1 tokens for the first level
            for (int i = 1; i < W; i++) {
                seq_id_look.resize(W - i);
                for (int j = 0; j < W - i; j++) {
                    seq_id_look[j] = i + j + 1;
                }

                common_batch_add(batch, tokens_j[0][i], n_past + i, seq_id_look, false);
            }

            // fill the rest of the levels
            for (int j = 1; j < N - 1; j++) {
                for (int i = 0; i < W; i++) {
                    common_batch_add(batch, tokens_j[j][i], n_past + j + i, { i + 1 }, j == N - 2);
                }
            }
        }

        if (llama_decode(ctx, batch) != 0) {
            LOG_ERR("\n\n%s: llama_decode failed - increase KV cache size\n", __func__);
            return 1;
        }

        int seq_id_best = 0;

        for (int v = 0; v < N; ++v) {
            int i_batch = 0;

            // if no active ngrams are left, it means the sampled token does not pass the verification
            if (v > 0) {
                for (int g = 0; g < (int) ngrams_cur.size(); g++) {
                    if (ngrams_cur[g].active) {
                        i_batch = ngrams_cur[g].i_batch[v];
                        seq_id_best = ngrams_cur[g].seq_id;

                        ++n_accept;
                        break;
                    }
                }

                // no more matches -> create a new batch
                if (i_batch == 0) {
                    break;
                }
            }

            // sample the next token
            id = common_sampler_sample(smpl, ctx, i_batch);

            common_sampler_accept(smpl, id, true);

            // print
            {
                const std::string token_str = common_token_to_piece(ctx, id);

                if (v == 0) {
                    LOG("%s", token_str.c_str());
                } else {
                    // print light cyan
                    LOG("\033[0;96m%s\033[0m", token_str.c_str());
                }
                fflush(stdout);

                if (llama_vocab_is_eog(vocab, id)) {
                    has_eos = true;
                }

                all.push_back(id);
            }

            ++n_predict;
            ++n_past;

            if ((params.n_predict >= 0 && n_predict > params.n_predict) || has_eos) {
                break;
            }

            // verify across active n-grams
            for (int g = 0; g < (int) ngrams_cur.size(); g++) {
                if (ngrams_cur[g].active) {
                    if (v == N - 1) {
                        ngrams_cur[g].active = false;
                    } else {
                        if (id != ngrams_cur[g].tokens[v + 1]) {
                            ngrams_cur[g].active = false;
                        }
                    }
                }
            }

            // print known n-grams starting with token id (debug)
            if (0 && v == 0) {
                if (ngrams_observed.cnt[id] > 0) {
                    LOG("\n - %d n-grams starting with '%s'\n", ngrams_observed.cnt[id], common_token_to_piece(ctx, id).c_str());
                }

                for (int i = 0; i < ngrams_observed.cnt[id]; i++) {
                    LOG("   - ngram %2d: ", i);

                    const int idx = id*(N - 1)*G + i*(N - 1);

                    for (int j = 0; j < N - 1; j++) {
                        const std::string token_str = common_token_to_piece(ctx, ngrams_observed.tokens[idx + j]);

                        LOG("%s", token_str.c_str());
                    }

                    LOG("\n");
                }
            }

            // update lookahead tokens
            {
                for (int i = 0; i < W; i++) {
                    tokens_j_prev[i] = tokens_j[0][i];
                }

                for (int j = 0; j < N - 2; j++) {
                    tokens_j[j] = tokens_j[j + 1];
                }

                if (v == 0) {
                    // sample from the last level
                    for (int i = 0; i < W; i++) {
                        tokens_j[N - 2][i] = common_sampler_sample(smpl, ctx, ngrams_cur.size()*(N-1) + W*(N - 2) + i);
                    }
                } else {
                    for (int i = 0; i < W; i++) {
                        // there are different ways to init these tokens
                        if (0) {
                            // random init
                            tokens_j[N - 2][i] = all[1 + rand() % (all.size() - 1)];
                        } else {
                            // init from the previous level
                            tokens_j[N - 2][i] = tokens_j[0][i];
                        }
                    }
                }
            }

            // update observed ngrams
            if (v == 0) {
                // the first token of the n-gram is determined by the index in the container so it is not stored
                std::vector<llama_token> ngram(N - 1);

                // n-gram generation
                // ref: https://github.com/hao-ai-lab/LookaheadDecoding/issues/14#issuecomment-1826198518
                for (int f = 0; f < W; ++f) {
                    const int ft = tokens_j_prev[f]; // first token of the n-gram

                    for (int j = 0; j < N - 1; ++j) {
                        ngram[j] = tokens_j[j][f];
                    }

                    // filter-out repeating n-grams
                    {
                        bool is_unique = true;

                        for (int k = 0; k < ngrams_observed.cnt[ft]; ++k) {
                            const int idx = ft*(N - 1)*G + k*(N - 1);

                            bool is_match = true;
                            for (int j = 0; j < N - 1; ++j) {
                                if (ngrams_observed.tokens[idx + j] != ngram[j]) {
                                    is_match = false;
                                    break;
                                }
                            }

                            if (is_match) {
                                is_unique = false;
                                break;
                            }
                        }

                        if (!is_unique) {
                            continue;
                        }
                    }

                    const int head = ngrams_observed.head[ft];
                    const int idx  = ft*(N - 1)*G + head*(N - 1);

                    for (int i = 0; i < N - 1; i++) {
                        ngrams_observed.tokens[idx + i] = ngram[i];
                    }

                    ngrams_observed.cnt[ft]  = std::min(G, ngrams_observed.cnt[ft] + 1);
                    ngrams_observed.head[ft] = (head + 1) % G;

                    ngrams_observed.n_total++;
                }
            }
        }

        if ((params.n_predict >= 0 && n_predict > params.n_predict) || has_eos) {
            break;
        }

        // KV cache management
        // if no verification token matched, we simply remove all cells from this batch -> no fragmentation
        llama_kv_self_seq_rm(ctx, -1, n_past, -1);

        if (seq_id_best != 0) {
            // if a verification token matched, we keep the best sequence and remove the rest
            // this leads to some KV cache fragmentation
            llama_kv_self_seq_keep(ctx, seq_id_best);
            llama_kv_self_seq_cp  (ctx, seq_id_best, 0, -1, -1);
            llama_kv_self_seq_rm  (ctx, seq_id_best,    -1, -1);

            for (int s = 1; s < W + G + 1; ++s) {
                llama_kv_self_seq_cp(ctx, 0, s, -1, -1);
            }
        }
    }

    auto t_dec_end = ggml_time_us();

    LOG("\n\n");

    LOG_INF("encoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n", n_input,   (t_enc_end - t_enc_start) / 1e6f, inp.size() / ((t_enc_end - t_enc_start) / 1e6f));
    LOG_INF("decoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n", n_predict, (t_dec_end - t_dec_start) / 1e6f, n_predict  / ((t_dec_end - t_dec_start) / 1e6f));

    LOG_INF("\n");
    LOG_INF("W = %2d\n", W);
    LOG_INF("N = %2d\n", N);
    LOG_INF("G = %2d\n", G);
    LOG_INF("\n");
    LOG_INF("n_predict = %d\n", n_predict);
    LOG_INF("n_accept  = %d\n", n_accept);

    LOG_INF("\n");
    common_perf_print(ctx, smpl);

    common_sampler_free(smpl);

    llama_kv_cache_view_free(&kvc_view);

    llama_batch_free(batch);

    llama_backend_free();

    LOG("\n\n");

    return 0;
}